

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

Long amrex::VisMF::Write(FabArray<amrex::FArrayBox> *mf,string *mf_name,How how,bool set_ghost)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  BaseFab<double> *pBVar5;
  pointer piVar6;
  pointer pcVar7;
  FArrayBox *pFVar8;
  Version VVar9;
  long *plVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  RealDescriptor *rd;
  int *piVar16;
  Vector<int,_std::allocator<int>_> *pVVar17;
  _Base_ptr p_Var18;
  double *pdVar19;
  void *out;
  Long LVar20;
  Version comm;
  BoxArray *this;
  FabArray<amrex::FArrayBox> *pFVar21;
  FabArray<amrex::FArrayBox> *pFVar22;
  int procToWrite;
  DestComp dcomp;
  int iVar23;
  pointer piVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  size_t __n;
  size_t sVar28;
  ulong uVar29;
  pair<double,_double> pVar30;
  FabArray<amrex::FArrayBox> *the_mf;
  Vector<int,_std::allocator<int>_> procsWithDataVector;
  string filePrefix;
  __string_type tstr;
  MFIter mfi_1;
  set<int,_std::less<int>,_std::allocator<int>_> procsWithData;
  stringstream hss;
  Header hdr;
  NFilesIter nfi;
  FabArray<amrex::FArrayBox> *local_780;
  ios_base *local_778;
  int local_76c;
  void *local_768;
  void *local_760;
  long local_758;
  FABio *local_750;
  Vector<int,_std::allocator<int>_> local_748;
  string local_728;
  string *local_708;
  long *local_700;
  long local_6f0 [2];
  MFIter local_6e0;
  size_t local_680;
  long local_678;
  long local_670;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_668;
  Box local_638 [4];
  ios_base aiStack_5b8 [264];
  Header local_4b0;
  undefined1 local_388 [700];
  bool local_cc;
  int local_bc;
  
  local_708 = mf_name;
  FArrayBox::getDataDescriptor();
  pFVar22 = local_780;
  rd = FPC::NativeRealDescriptor();
  bVar11 = RealDescriptor::operator!=((RealDescriptor *)pFVar22,rd);
  if ((set_ghost) &&
     ((*(long *)(mf->super_FabArrayBase).n_grow.vect != 0 ||
      ((mf->super_FabArrayBase).n_grow.vect[2] != 0)))) {
    MFIter::MFIter((MFIter *)local_388,&mf->super_FabArrayBase,'\0');
    if ((int)local_388._32_4_ < (int)local_388._40_4_) {
      this = &(mf->super_FabArrayBase).boxarray;
      do {
        if (0 < (mf->super_FabArrayBase).n_comp) {
          dcomp.i = 0;
          lVar25 = (long)*(int *)(*(long *)local_388._56_8_ + (long)(int)local_388._32_4_ * 4) *
                   0x1c;
          do {
            piVar16 = (int *)(local_388 + 0x20);
            if ((Vector<int,_std::allocator<int>_> *)local_388._64_8_ !=
                (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar16 = (((vector<int,_std::allocator<int>_> *)local_388._64_8_)->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + (int)local_388._32_4_;
            }
            pBVar5 = &(mf->m_fabs_v).
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar16]->super_BaseFab<double>;
            BATransformer::operator()
                      (local_638,&this->m_bat,
                       (Box *)(*(long *)&(((mf->super_FabArrayBase).boxarray.m_ref.
                                           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_abox).
                                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         ._M_impl.super__Vector_impl_data + lVar25));
            pVar30 = BaseFab<double>::minmax<(amrex::RunOn)1>(pBVar5,local_638,dcomp.i);
            local_4b0._0_8_ = (pVar30.second + pVar30.first) * 0.5;
            piVar16 = (int *)(local_388 + 0x20);
            if ((Vector<int,_std::allocator<int>_> *)local_388._64_8_ !=
                (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar16 = (((vector<int,_std::allocator<int>_> *)local_388._64_8_)->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + (int)local_388._32_4_;
            }
            pBVar5 = &(mf->m_fabs_v).
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar16]->super_BaseFab<double>;
            BATransformer::operator()
                      (local_638,&this->m_bat,
                       (Box *)(*(long *)&(((mf->super_FabArrayBase).boxarray.m_ref.
                                           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_abox).
                                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         ._M_impl.super__Vector_impl_data + lVar25));
            BaseFab<double>::setComplement<(amrex::RunOn)1>
                      (pBVar5,(double *)&local_4b0,local_638,dcomp,(NumComps)0x1);
            dcomp.i = dcomp.i + 1;
          } while (dcomp.i < (mf->super_FabArrayBase).n_comp);
        }
        MFIter::operator++((MFIter *)local_388);
      } while ((int)local_388._32_4_ < (int)local_388._40_4_);
    }
    MFIter::~MFIter((MFIter *)local_388);
  }
  pVVar17 = DistributionMapping::ProcessorMap(&(mf->super_FabArrayBase).distributionMap);
  p_Var1 = &local_668._M_impl.super__Rb_tree_header;
  local_668._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_668._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_668._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_748.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (int *)0x0;
  local_748.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_748.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  piVar24 = (pVVar17->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (pVVar17->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  local_668._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_668._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (piVar6 != piVar24 && -1 < (long)piVar6 - (long)piVar24) {
    lVar25 = 0;
    lVar27 = 0;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_668,(int *)((long)piVar24 + lVar25));
      lVar27 = lVar27 + 1;
      piVar24 = (pVVar17->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar25 = lVar25 + 4;
    } while (lVar27 < (long)(pVVar17->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar24 >> 2);
  }
  if (allowSparseWrites == '\0') {
    bVar12 = false;
  }
  else if ((int)local_668._M_impl.super__Rb_tree_header._M_node_count < nOutFiles) {
    bVar12 = true;
    if ((_Rb_tree_header *)local_668._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var18 = local_668._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if (local_748.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
            == local_748.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_748,
                     (iterator)
                     local_748.super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish,(int *)(p_Var18 + 1));
        }
        else {
          *local_748.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               p_Var18[1]._M_color;
          local_748.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               local_748.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish + 1;
        }
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
      } while ((_Rb_tree_header *)p_Var18 != p_Var1);
    }
  }
  else {
    bVar12 = false;
  }
  Header::Header(&local_4b0,mf,how,currentVersion,false,ParallelDescriptor::m_comm);
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  pcVar7 = (local_708->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_728,pcVar7,pcVar7 + local_708->_M_string_length);
  std::__cxx11::string::append((char *)&local_728);
  NFilesIter::NFilesIter((NFilesIter *)local_388,nOutFiles,&local_728,(bool)groupSets,(bool)setBuf);
  VVar9 = currentVersion;
  if (bVar12) {
    NFilesIter::SetSparseFPP((NFilesIter *)local_388,&local_748);
  }
  else if (useDynamicSetSelection == '\x01') {
    NFilesIter::SetDynamic((NFilesIter *)local_388,-1);
  }
  local_76c = 0;
  local_778 = aiStack_5b8;
  pFVar21 = (FabArray<amrex::FArrayBox> *)(local_388 + 0x80);
  uVar26 = 0;
  pFVar22 = pFVar21;
  while( true ) {
    bVar12 = NFilesIter::ReadyToWrite((NFilesIter *)local_388,false);
    comm = (Version)pFVar22;
    if (!bVar12) break;
    local_750 = FArrayBox::getFABio();
    iVar13 = RealDescriptor::numBytes((RealDescriptor *)local_780);
    MFIter::MFIter(&local_6e0,&mf->super_FabArrayBase,'\0');
    if (local_6e0.currentIndex < local_6e0.endIndex) {
      iVar23 = 1;
      do {
        iVar14 = local_6e0.currentIndex;
        if (local_6e0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          iVar14 = ((local_6e0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[local_6e0.currentIndex];
        }
        pFVar8 = (mf->m_fabs_v).
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[iVar14];
        if (VVar9 == Version_v1) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_638);
          (*local_750->_vptr_FABio[6])
                    (local_750,local_638[0].bigend.vect + 1,pFVar8,
                     (ulong)(uint)(pFVar8->super_BaseFab<double>).nvar);
          lVar25 = std::ostream::tellp();
          uVar26 = uVar26 + lVar25;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_638);
          std::ios_base::~ios_base(local_778);
        }
        uVar26 = (long)(mf->super_FabArrayBase).n_comp *
                 (long)(((pFVar8->super_BaseFab<double>).domain.bigend.vect[2] -
                        (pFVar8->super_BaseFab<double>).domain.smallend.vect[2]) + 1) *
                 (long)(((pFVar8->super_BaseFab<double>).domain.bigend.vect[1] -
                        (pFVar8->super_BaseFab<double>).domain.smallend.vect[1]) + 1) *
                 (long)(((pFVar8->super_BaseFab<double>).domain.bigend.vect[0] -
                        (pFVar8->super_BaseFab<double>).domain.smallend.vect[0]) + 1) * (long)iVar13
                 + uVar26;
        pFVar22 = mf;
        MFIter::operator++(&local_6e0);
        iVar23 = iVar23 + -1;
      } while (local_6e0.currentIndex < local_6e0.endIndex);
      bVar12 = iVar23 != 0;
    }
    else {
      bVar12 = false;
    }
    MFIter::~MFIter(&local_6e0);
    if (((bVar12 || bVar11) && (useSingleWrite == '\x01')) &&
       (local_760 = operator_new__(uVar26,(nothrow_t *)&std::nothrow), local_760 != (void *)0x0)) {
      MFIter::MFIter(&local_6e0,&mf->super_FabArrayBase,'\0');
      if (local_6e0.currentIndex < local_6e0.endIndex) {
        local_678 = (long)iVar13;
        lVar25 = 0;
        do {
          iVar13 = local_6e0.currentIndex;
          if (local_6e0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            iVar13 = ((local_6e0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[local_6e0.currentIndex];
          }
          pBVar5 = &(mf->m_fabs_v).
                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar13]->super_BaseFab<double>;
          iVar13 = (pBVar5->domain).bigend.vect[0];
          iVar23 = (pBVar5->domain).bigend.vect[1];
          iVar14 = (pBVar5->domain).smallend.vect[0];
          iVar2 = (pBVar5->domain).smallend.vect[1];
          iVar3 = (pBVar5->domain).bigend.vect[2];
          iVar4 = (pBVar5->domain).smallend.vect[2];
          local_758 = (long)(mf->super_FabArrayBase).n_comp;
          local_768 = (void *)((long)local_760 + lVar25);
          local_670 = lVar25;
          if (VVar9 == Version_v1) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_638);
            (*local_750->_vptr_FABio[6])
                      (local_750,local_638[0].bigend.vect + 1,pBVar5,(ulong)(uint)pBVar5->nvar);
            iVar15 = std::ostream::tellp();
            std::__cxx11::stringbuf::str();
            plVar10 = local_700;
            local_680 = (size_t)iVar15;
            memcpy(local_768,local_700,local_680);
            if (plVar10 != local_6f0) {
              operator_delete(plVar10,local_6f0[0] + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_638);
            std::ios_base::~ios_base(local_778);
            sVar28 = local_680;
          }
          else {
            sVar28 = 0;
          }
          pFVar22 = (FabArray<amrex::FArrayBox> *)
                    ((long)((iVar23 - iVar2) + 1) * (long)((iVar13 - iVar14) + 1));
          lVar25 = ((iVar3 - iVar4) + 1) * local_758 * (long)pFVar22;
          __n = lVar25 * local_678;
          pdVar19 = BaseFab<double>::dataPtr(pBVar5,0);
          if (bVar11) {
            pFVar22 = local_780;
            RealDescriptor::convertFromNativeFormat
                      ((void *)((long)local_768 + sVar28),lVar25,pdVar19,(RealDescriptor *)local_780
                      );
          }
          else {
            memcpy((void *)((long)local_768 + sVar28),pdVar19,__n);
          }
          lVar25 = __n + local_670 + sVar28;
          MFIter::operator++(&local_6e0);
        } while (local_6e0.currentIndex < local_6e0.endIndex);
      }
      MFIter::~MFIter(&local_6e0);
      std::ostream::write((char *)pFVar21,(long)local_760);
      std::ostream::flush();
      operator_delete__(local_760);
    }
    else {
      MFIter::MFIter(&local_6e0,&mf->super_FabArrayBase,'\0');
      if (local_6e0.currentIndex < local_6e0.endIndex) {
        local_768 = (void *)(long)iVar13;
        do {
          iVar13 = local_6e0.currentIndex;
          if (local_6e0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            iVar13 = ((local_6e0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[local_6e0.currentIndex];
          }
          pBVar5 = &(mf->m_fabs_v).
                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar13]->super_BaseFab<double>;
          iVar13 = (pBVar5->domain).bigend.vect[0];
          iVar23 = (pBVar5->domain).smallend.vect[0];
          iVar14 = (pBVar5->domain).bigend.vect[1];
          iVar2 = (pBVar5->domain).smallend.vect[1];
          iVar3 = (pBVar5->domain).bigend.vect[2];
          iVar4 = (pBVar5->domain).smallend.vect[2];
          lVar25 = (long)(mf->super_FabArrayBase).n_comp;
          if (VVar9 == Version_v1) {
            local_758 = lVar25;
            std::__cxx11::stringstream::stringstream((stringstream *)local_638);
            (*local_750->_vptr_FABio[6])
                      (local_750,local_638[0].bigend.vect + 1,pBVar5,(ulong)(uint)pBVar5->nvar);
            std::ostream::tellp();
            std::__cxx11::stringbuf::str();
            std::ostream::write((char *)pFVar21,(long)local_700);
            std::ostream::flush();
            if (local_700 != local_6f0) {
              operator_delete(local_700,local_6f0[0] + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_638);
            std::ios_base::~ios_base(local_778);
            lVar25 = local_758;
          }
          pFVar22 = (FabArray<amrex::FArrayBox> *)
                    ((long)((iVar14 - iVar2) + 1) * (long)((iVar13 - iVar23) + 1));
          lVar25 = ((iVar3 - iVar4) + 1) * lVar25 * (long)pFVar22;
          uVar29 = lVar25 * (long)local_768;
          pdVar19 = BaseFab<double>::dataPtr(pBVar5,0);
          if (bVar11) {
            out = operator_new__(uVar29);
            pFVar22 = local_780;
            RealDescriptor::convertFromNativeFormat(out,lVar25,pdVar19,(RealDescriptor *)local_780);
            std::ostream::write((char *)pFVar21,(long)out);
            std::ostream::flush();
            operator_delete__(out);
          }
          else {
            std::ostream::write((char *)pFVar21,(long)pdVar19);
            std::ostream::flush();
          }
          MFIter::operator++(&local_6e0);
        } while (local_6e0.currentIndex < local_6e0.endIndex);
      }
      MFIter::~MFIter(&local_6e0);
    }
    NFilesIter::operator++((NFilesIter *)local_388);
  }
  if (local_cc == false) {
    local_76c = local_bc;
  }
  if ((currentVersion & ~NoFabHeader_v1) == Version_v1) {
    Header::CalculateMinMax(&local_4b0,mf,procToWrite,comm);
  }
  FindOffsets(mf,&local_728,&local_4b0,comm,(NFilesIter *)local_388,ParallelDescriptor::m_comm);
  LVar20 = WriteHeader(local_708,&local_4b0,local_76c,comm);
  NFilesIter::~NFilesIter((NFilesIter *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  Header::~Header(&local_4b0);
  if (local_748.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_748.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_748.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_748.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_668);
  if (local_780 != (FabArray<amrex::FArrayBox> *)0x0) {
    std::default_delete<amrex::RealDescriptor>::operator()
              ((default_delete<amrex::RealDescriptor> *)&local_780,(RealDescriptor *)local_780);
  }
  return LVar20 + uVar26;
}

Assistant:

Long
VisMF::Write (const FabArray<FArrayBox>&    mf,
              const std::string& mf_name,
              VisMF::How         how,
              bool               set_ghost)
{
    BL_PROFILE("VisMF::Write(FabArray)");
    BL_ASSERT(mf_name[mf_name.length() - 1] != '/');
    BL_ASSERT(currentVersion != VisMF::Header::Undefined_v1);

    // ---- add stream retry
    // ---- add stream buffer (to nfiles)
    auto whichRD = FArrayBox::getDataDescriptor();
    bool doConvert(*whichRD != FPC::NativeRealDescriptor());

    if(set_ghost && mf.nGrowVect() != 0) {
        FabArray<FArrayBox>* the_mf = const_cast<FabArray<FArrayBox>*>(&mf);

        bool run_on_device = Gpu::inLaunchRegion()
            && (mf.arena()->isManaged() || mf.arena()->isDevice());

        for(MFIter mfi(*the_mf); mfi.isValid(); ++mfi) {
            const int idx(mfi.index());

            for(int j(0); j < mf.nComp(); ++j) {
                auto mm = (run_on_device) ? mf[mfi].minmax<RunOn::Device>(mf.box(idx),j)
                                          : mf[mfi].minmax<RunOn::Host  >(mf.box(idx),j);
                const Real val = (mm.first + mm.second) / 2.0_rt;
                if (run_on_device) {
                    the_mf->get(mfi).setComplement<RunOn::Device>(val, mf.box(idx), j, 1);
                } else {
                    the_mf->get(mfi).setComplement<RunOn::Host>(val, mf.box(idx), j, 1);
                }
            }
        }
    }

    // ---- check if mf has sparse data
    bool useSparseFPP(false);
    const Vector<int> &pmap = mf.DistributionMap().ProcessorMap();
    std::set<int> procsWithData;
    Vector<int> procsWithDataVector;
    for(int i(0); i < pmap.size(); ++i) {
      procsWithData.insert(pmap[i]);
    }
    if(allowSparseWrites && (static_cast<int>(procsWithData.size()) < nOutFiles)) {
      useSparseFPP = true;
//      amrex::Print() << "SSSSSSSS:  in VisMF::Write:  useSparseFPP for:  " << mf_name << '\n';
      for(std::set<int>::iterator it = procsWithData.begin(); it != procsWithData.end(); ++it) {
        procsWithDataVector.push_back(*it);
      }
    }

    int coordinatorProc(ParallelDescriptor::IOProcessorNumber());
    Long bytesWritten(0);
    bool calcMinMax(false);
    VisMF::Header hdr(mf, how, currentVersion, calcMinMax);

    std::string filePrefix(mf_name + FabFileSuffix);

    NFilesIter nfi(nOutFiles, filePrefix, groupSets, setBuf);

    bool oldHeader(currentVersion == VisMF::Header::Version_v1);

    if(useSparseFPP) {
        nfi.SetSparseFPP(procsWithDataVector);
    } else if(useDynamicSetSelection) {
        nfi.SetDynamic();
    }
    for( ; nfi.ReadyToWrite(); ++nfi) {
        // ---- find the total number of bytes including fab headers if needed
        const FABio &fio = FArrayBox::getFABio();
        int whichRDBytes(whichRD->numBytes()), nFABs(0);
        Long writeDataItems(0), writeDataSize(0);
        for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
            const FArrayBox &fab = mf[mfi];
            if(oldHeader) {
                std::stringstream hss;
                fio.write_header(hss, fab, fab.nComp());
                bytesWritten += static_cast<std::streamoff>(hss.tellp());
            }
            bytesWritten += fab.box().numPts() * mf.nComp() * whichRDBytes;
            ++nFABs;
        }
        char *allFabData(nullptr);
        bool canCombineFABs(false);
        if((nFABs > 1 || doConvert) && VisMF::useSingleWrite) {
            allFabData = new(std::nothrow) char[bytesWritten];
        }    // ---- else { no need to make a copy for one fab }
        if(allFabData == nullptr) {
            canCombineFABs = false;
        } else {
            canCombineFABs = true;
        }

        if(canCombineFABs) {
            Long writePosition(0);
            for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
                int hLength(0);
                const FArrayBox &fab = mf[mfi];
                writeDataItems = fab.box().numPts() * mf.nComp();
                writeDataSize = writeDataItems * whichRDBytes;
                char *afPtr = allFabData + writePosition;
                if(oldHeader) {
                    std::stringstream hss;
                    fio.write_header(hss, fab, fab.nComp());
                    hLength = static_cast<std::streamoff>(hss.tellp());
                    auto tstr = hss.str();
                    std::memcpy(afPtr, tstr.c_str(), hLength);  // ---- the fab header
                }
                Real const* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
                std::unique_ptr<FArrayBox> hostfab;
                if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
                    hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(),
                                                          The_Pinned_Arena());
                    Gpu::dtoh_memcpy_async(hostfab->dataPtr(), fab.dataPtr(),
                                           fab.size()*sizeof(Real));
                    Gpu::streamSynchronize();
                    fabdata = hostfab->dataPtr();
                }
#endif
                if(doConvert) {
                    RealDescriptor::convertFromNativeFormat(static_cast<void *> (afPtr + hLength),
                                                            writeDataItems,
                                                            fabdata, *whichRD);
                } else {    // ---- copy from the fab
                    memcpy(afPtr + hLength, fabdata, writeDataSize);
                }
                writePosition += hLength + writeDataSize;
            }
            nfi.Stream().write(allFabData, bytesWritten);
            nfi.Stream().flush();
            delete [] allFabData;

        } else {    // ---- write fabs individually
            for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
                int hLength(0);
                const FArrayBox &fab = mf[mfi];
                writeDataItems = fab.box().numPts() * mf.nComp();
                writeDataSize = writeDataItems * whichRDBytes;
                if(oldHeader) {
                    std::stringstream hss;
                    fio.write_header(hss, fab, fab.nComp());
                    hLength = static_cast<std::streamoff>(hss.tellp());
                    auto tstr = hss.str();
                    nfi.Stream().write(tstr.c_str(), hLength);    // ---- the fab header
                    nfi.Stream().flush();
                }
                Real const* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
                std::unique_ptr<FArrayBox> hostfab;
                if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
                    hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(),
                                                          The_Pinned_Arena());
                    Gpu::dtoh_memcpy_async(hostfab->dataPtr(), fab.dataPtr(),
                                           fab.size()*sizeof(Real));
                    Gpu::streamSynchronize();
                    fabdata = hostfab->dataPtr();
                }
#endif
                if(doConvert) {
                    char *cDataPtr = new char[writeDataSize];
                    RealDescriptor::convertFromNativeFormat(static_cast<void *> (cDataPtr),
                                                            writeDataItems,
                                                            fabdata, *whichRD);
                    nfi.Stream().write(cDataPtr, writeDataSize);
                    nfi.Stream().flush();
                    delete [] cDataPtr;
                } else {    // ---- copy from the fab
                    nfi.Stream().write((char *) fabdata, writeDataSize);
                    nfi.Stream().flush();
                }
            }
        }
    }

    if(nfi.GetDynamic()) {
        coordinatorProc = nfi.CoordinatorProc();
    }

    if(currentVersion == VisMF::Header::Version_v1 ||
       currentVersion == VisMF::Header::NoFabHeaderMinMax_v1)
    {
        hdr.CalculateMinMax(mf, coordinatorProc);
    }

    VisMF::FindOffsets(mf, filePrefix, hdr, currentVersion, nfi,
                       ParallelDescriptor::Communicator());

    bytesWritten += VisMF::WriteHeader(mf_name, hdr, coordinatorProc);

    return bytesWritten;
}